

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O0

void cmCacheManager::OutputValue(ostream *fout,string *value)

{
  ulong uVar1;
  char *pcVar2;
  ostream *poVar3;
  string *value_local;
  ostream *fout_local;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::size();
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)value);
    if (*pcVar2 != ' ') {
      std::__cxx11::string::size();
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)value);
      if (*pcVar2 != '\t') goto LAB_0078b2e8;
    }
    poVar3 = std::operator<<(fout,'\'');
    poVar3 = std::operator<<(poVar3,(string *)value);
    std::operator<<(poVar3,'\'');
  }
  else {
LAB_0078b2e8:
    std::operator<<(fout,(string *)value);
  }
  return;
}

Assistant:

void cmCacheManager::OutputValue(std::ostream& fout, std::string const& value)
{
  // if value has trailing space or tab, enclose it in single quotes
  if (!value.empty() &&
      (value[value.size() - 1] == ' ' ||
       value[value.size() - 1] == '\t'))
    {
    fout << '\'' << value << '\'';
    }
  else
    {
    fout << value;
    }
}